

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.cc
# Opt level: O1

void __thiscall gutil::Properties::save(Properties *this,ostream *out,char *comment)

{
  size_t sVar1;
  ostream *poVar2;
  _Rb_tree_node_base *p_Var3;
  
  if (comment != (char *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"# ",2);
    sVar1 = strlen(comment);
    std::__ostream_insert<char,std::char_traits<char>>(out,comment,sVar1);
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + (char)out);
    std::ostream::put((char)out);
    std::ostream::flush();
  }
  for (p_Var3 = (this->data)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->data)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,*(char **)(p_Var3 + 1),(long)p_Var3[1]._M_parent);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"=",1);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,*(char **)(p_Var3 + 2),(long)p_Var3[2]._M_parent);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  return;
}

Assistant:

void Properties::save(std::ostream& out, const char *comment) const
{
  if (comment != 0)
  {
    out << "# " << comment << std::endl;
  }

  for (std::map<std::string, std::string>::const_iterator it=data.begin(); it!=data.end(); ++it)
  {
    out << it->first << "=" << it->second << std::endl;
  }
}